

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

bool __thiscall
llvm::consumeUnsignedInteger(llvm *this,StringRef *Str,uint Radix,unsigned_long_long *Result)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  
  uVar3 = (uint)Str;
  if (uVar3 == 0) {
    uVar3 = GetAutoSenseRadix((StringRef *)this);
  }
  lVar2 = *(long *)(this + 8);
  bVar4 = true;
  if (lVar2 != 0) {
    pbVar8 = *(byte **)this;
    *(ulong *)CONCAT44(in_register_00000014,Radix) = 0;
    lVar9 = lVar2;
    uVar10 = 0;
    do {
      bVar1 = *pbVar8;
      if ((char)bVar1 < 0x30) goto LAB_0015a5d6;
      iVar5 = -0x30;
      if (0x39 < bVar1) {
        if (bVar1 < 0x61) {
          iVar5 = -0x37;
          if (0x19 < (byte)(bVar1 + 0xbf)) goto LAB_0015a5d6;
        }
        else {
          iVar5 = -0x57;
          if (0x7a < bVar1) goto LAB_0015a5d6;
        }
      }
      uVar6 = iVar5 + (char)bVar1;
      if (uVar3 <= uVar6) goto LAB_0015a5d6;
      uVar7 = (ulong)uVar6 + uVar10 * uVar3;
      *(ulong *)CONCAT44(in_register_00000014,Radix) = uVar7;
      if (uVar7 / uVar3 < uVar10) {
        return true;
      }
      pbVar8 = pbVar8 + 1;
      lVar9 = lVar9 + -1;
      uVar10 = uVar7;
    } while (lVar9 != 0);
    lVar9 = 0;
LAB_0015a5d6:
    if (lVar2 != lVar9) {
      *(byte **)this = pbVar8;
      *(long *)(this + 8) = lVar9;
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool llvm::consumeUnsignedInteger(StringRef &Str, unsigned Radix,
                                  unsigned long long &Result) {
  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Parse all the bytes of the string given this radix.  Watch for overflow.
  StringRef Str2 = Str;
  Result = 0;
  while (!Str2.empty()) {
    unsigned CharVal;
    if (Str2[0] >= '0' && Str2[0] <= '9')
      CharVal = Str2[0] - '0';
    else if (Str2[0] >= 'a' && Str2[0] <= 'z')
      CharVal = Str2[0] - 'a' + 10;
    else if (Str2[0] >= 'A' && Str2[0] <= 'Z')
      CharVal = Str2[0] - 'A' + 10;
    else
      break;

    // If the parsed value is larger than the integer radix, we cannot
    // consume any more characters.
    if (CharVal >= Radix)
      break;

    // Add in this character.
    unsigned long long PrevResult = Result;
    Result = Result * Radix + CharVal;

    // Check for overflow by shifting back and seeing if bits were lost.
    if (Result / Radix < PrevResult)
      return true;

    Str2 = Str2.substr(1);
  }

  // We consider the operation a failure if no characters were consumed
  // successfully.
  if (Str.size() == Str2.size())
    return true;

  Str = Str2;
  return false;
}